

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_add_many(REF_NODE ref_node,REF_INT n,REF_GLOB *global_orig)

{
  REF_STATUS RVar1;
  uint uVar2;
  int iVar3;
  REF_GLOB *original;
  REF_INT *sorted_index;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  uint uVar8;
  REF_INT local;
  REF_INT local_34;
  
  if (n < 0) {
    pcVar7 = "malloc global of REF_GLOB negative";
    uVar4 = 0x179;
LAB_001370f1:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
           "ref_node_add_many",pcVar7);
    RVar1 = 1;
  }
  else {
    original = (REF_GLOB *)malloc((ulong)(uint)n * 8);
    if (original == (REF_GLOB *)0x0) {
      pcVar7 = "malloc global of REF_GLOB NULL";
      uVar4 = 0x179;
    }
    else {
      if (n == 0) {
        uVar8 = 0;
      }
      else {
        uVar6 = 0;
        uVar8 = 0;
        do {
          RVar1 = ref_node_local(ref_node,global_orig[uVar6],&local_34);
          if (RVar1 == 5) {
            original[(int)uVar8] = global_orig[uVar6];
            uVar8 = uVar8 + 1;
          }
          uVar6 = uVar6 + 1;
        } while ((uint)n != uVar6);
      }
      if ((int)uVar8 < 0) {
        pcVar7 = "malloc sorted of REF_INT negative";
        uVar4 = 0x186;
        goto LAB_001370f1;
      }
      sorted_index = (REF_INT *)malloc((ulong)uVar8 * 4);
      if (sorted_index != (REF_INT *)0x0) {
        uVar2 = ref_sort_heap_glob(uVar8,original,sorted_index);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x188,"ref_node_add_many",(ulong)uVar2,"heap");
          return uVar2;
        }
        if (1 < (int)uVar8) {
          iVar3 = 0;
          uVar6 = 1;
          do {
            if (original[sorted_index[uVar6]] == original[sorted_index[iVar3]]) {
              original[sorted_index[uVar6]] = -1;
            }
            else {
              iVar3 = (int)uVar6;
            }
            uVar6 = uVar6 + 1;
          } while (uVar8 != uVar6);
        }
        if (uVar8 != 0) {
          uVar6 = 1;
          if (1 < (int)uVar8) {
            uVar6 = (ulong)uVar8;
          }
          uVar5 = 0;
          do {
            if ((original[uVar5] != -1) &&
               (uVar8 = ref_node_add_core(ref_node,original[uVar5],&local_34), uVar8 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x197,"ref_node_add_many",(ulong)uVar8,"add core");
              return uVar8;
            }
            uVar5 = uVar5 + 1;
          } while (uVar6 != uVar5);
        }
        uVar8 = ref_node_rebuild_sorted_global(ref_node);
        if (uVar8 == 0) {
          free(sorted_index);
          free(original);
          return 0;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x19a,"ref_node_add_many",(ulong)uVar8,"rebuild globals");
        return uVar8;
      }
      pcVar7 = "malloc sorted of REF_INT NULL";
      uVar4 = 0x186;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
           "ref_node_add_many",pcVar7);
    RVar1 = 2;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_node_add_many(REF_NODE ref_node, REF_INT n,
                                     REF_GLOB *global_orig) {
  REF_STATUS status;
  REF_INT i, j, local, nadd;

  REF_GLOB *global;
  REF_INT *sorted;

  /* copy, removing existing nodes from list */

  ref_malloc(global, n, REF_GLOB);

  nadd = 0;
  for (i = 0; i < n; i++) {
    status = ref_node_local(ref_node, global_orig[i], &local);
    if (REF_NOT_FOUND == status) {
      global[nadd] = global_orig[i];
      nadd++;
    }
  }

  /* remove duplicates from list so core add can be used with existing check */

  ref_malloc(sorted, nadd, REF_INT);

  RSS(ref_sort_heap_glob(nadd, global, sorted), "heap");

  j = 0;
  for (i = 1; i < nadd; i++) {
    if (global[sorted[i]] != global[sorted[j]]) {
      j = i;
      continue;
    }
    global[sorted[i]] = REF_EMPTY;
  }

  /* add remaining via core */

  for (i = 0; i < nadd; i++)
    if (REF_EMPTY != global[i]) {
      RSS(ref_node_add_core(ref_node, global[i], &local), "add core");
    }

  RSS(ref_node_rebuild_sorted_global(ref_node), "rebuild globals");

  ref_free(sorted);
  ref_free(global);

  return REF_SUCCESS;
}